

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O2

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_getGlobalNode<llvm::Value*>
          (DependenceGraph<dg::LLVMNode> *this,Value *k)

{
  _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::LLVMNode_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
  *this_00;
  iterator iVar1;
  Value *local_10;
  
  this_00 = &((this->global_nodes).
              super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_t;
  if ((this_00 !=
       (_Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::LLVMNode_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
        *)0x0) &&
     (local_10 = k,
     iVar1 = std::
             _Rb_tree<llvm::Value_*,_std::pair<llvm::Value_*const,_dg::LLVMNode_*>,_std::_Select1st<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
             ::find(this_00,&local_10),
     (_Rb_tree_header *)iVar1._M_node !=
     &(((this->global_nodes).
        super___shared_ptr<std::map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header)) {
    return (LLVMNode *)iVar1._M_node[1]._M_parent;
  }
  return (LLVMNode *)0x0;
}

Assistant:

NodeT *_getGlobalNode(T k) {
        if (global_nodes) {
            auto it = global_nodes->find(k);
            if (it != global_nodes->end())
                return it->second;
        }

        return nullptr;
    }